

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::CustomLayerParams::_InternalParse
          (CustomLayerParams *this,char *ptr,ParseContext *ctx)

{
  uint tag_00;
  bool bVar1;
  string *s;
  WeightParams *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar2;
  char cVar3;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = ptr;
LAB_0020aab7:
  do {
    bVar1 = google::protobuf::internal::ParseContext::Done(ctx,&local_48);
    if (bVar1) {
      return local_48;
    }
    local_48 = google::protobuf::internal::ReadTag(local_48,&local_3c,0);
    tag_00 = local_3c;
    uVar2 = local_3c >> 3;
    cVar3 = (char)local_3c;
    if (uVar2 == 0x28) {
      if (cVar3 != 'B') goto LAB_0020abfe;
      s = _internal_mutable_description_abi_cxx11_(this);
LAB_0020abcd:
      local_48 = google::protobuf::internal::InlineGreedyStringParser(s,local_48,ctx);
      bVar1 = google::protobuf::internal::VerifyUTF8(s,(char *)0x0);
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    else {
      if (uVar2 == 0x14) {
        if (cVar3 == -0x5e) {
          local_48 = local_48 + -2;
          do {
            local_48 = local_48 + 2;
            msg = google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::Add
                            (&this->weights_);
            local_48 = google::protobuf::internal::ParseContext::ParseMessage
                                 (ctx,&msg->super_MessageLite,local_48);
            if (local_48 == (char *)0x0) {
              return (char *)0x0;
            }
          } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                  (bVar1 = google::protobuf::internal::ExpectTag<162u>(local_48), bVar1));
          goto LAB_0020aab7;
        }
      }
      else if (uVar2 == 0x1e) {
        if (cVar3 == -0xe) {
          local_48 = local_48 + -2;
          do {
            local_48 = local_48 + 2;
            local_48 = google::protobuf::internal::ParseContext::
                       ParseMessage<google::protobuf::internal::MapFieldLite<CoreML::Specification::CustomLayerParams_ParametersEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>,_true>
                                 (ctx,&this->parameters_,local_48);
            if (local_48 == (char *)0x0) {
              return (char *)0x0;
            }
          } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                  (bVar1 = google::protobuf::internal::ExpectTag<242u>(local_48), bVar1));
          goto LAB_0020aab7;
        }
      }
      else if ((uVar2 == 10) && (cVar3 == 'R')) {
        s = _internal_mutable_classname_abi_cxx11_(this);
        goto LAB_0020abcd;
      }
LAB_0020abfe:
      if ((local_3c == 0) || ((local_3c & 7) == 4)) {
        if (local_48 == (char *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
        return local_48;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>(local_38);
      local_48 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
    }
    if (local_48 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* CustomLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // string className = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 82)) {
          auto str = _internal_mutable_classname();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .CoreML.Specification.WeightParams weights = 20;
      case 20:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 162)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_weights(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<162>(ptr));
        } else
          goto handle_unusual;
        continue;
      // map<string, .CoreML.Specification.CustomLayerParams.CustomLayerParamValue> parameters = 30;
      case 30:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 242)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(&parameters_, ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<242>(ptr));
        } else
          goto handle_unusual;
        continue;
      // string description = 40;
      case 40:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 66)) {
          auto str = _internal_mutable_description();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}